

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void dr_prediction_z3_32x32_sse4_1
               (uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  bool bVar1;
  bool bVar16;
  bool bVar31;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined1 auVar65 [16];
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  int iVar76;
  int iVar77;
  undefined8 *puVar78;
  long lVar79;
  long lVar80;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  ushort uVar81;
  ushort uVar87;
  ushort uVar89;
  ulong uVar83;
  ushort uVar91;
  ushort uVar93;
  ushort uVar96;
  ushort uVar98;
  ulong uVar95;
  ushort uVar100;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  short sVar82;
  short sVar88;
  short sVar90;
  short sVar92;
  short sVar94;
  short sVar97;
  short sVar99;
  short sVar101;
  undefined1 auVar86 [16];
  int j_2;
  int j_1;
  __m128i d_h [32];
  __m128i dstvec_h [32];
  __m128i d [32];
  __m128i dstvec [32];
  int mdiff;
  int jj;
  int j;
  __m128i shift;
  int i;
  int base_max_diff;
  int base;
  __m128i a1_above;
  __m128i a0_above;
  __m128i res16 [2];
  __m128i res1;
  __m128i res;
  __m128i b;
  int r;
  int x;
  __m128i c3f;
  __m128i diff;
  __m128i a_mbase_x;
  __m128i a16;
  __m128i a32;
  __m128i a1;
  __m128i a0;
  int max_base_x;
  int frac_bits;
  int local_d10;
  int local_d0c;
  undefined8 local_d08 [13];
  __m128i *in_stack_fffffffffffff360;
  __m128i *in_stack_fffffffffffff368;
  undefined1 local_b08 [512];
  undefined8 local_908 [64];
  undefined1 local_708 [528];
  long local_4f8;
  long local_4f0;
  int local_464;
  int local_460;
  int local_45c;
  ushort local_458;
  ushort uStack_456;
  ushort uStack_454;
  ushort uStack_452;
  ushort uStack_450;
  ushort uStack_44e;
  ushort uStack_44c;
  ushort uStack_44a;
  int local_444;
  int local_440;
  int local_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ushort local_3f8;
  ushort uStack_3f6;
  ushort uStack_3f4;
  ushort uStack_3f2;
  ushort uStack_3f0;
  ushort uStack_3ee;
  ushort uStack_3ec;
  ushort uStack_3ea;
  ushort local_3e8;
  ushort uStack_3e6;
  ushort uStack_3e4;
  ushort uStack_3e2;
  ushort uStack_3e0;
  ushort uStack_3de;
  ushort uStack_3dc;
  ushort uStack_3da;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  int local_3c0;
  int local_3bc;
  ulong local_3b8;
  ulong uStack_3b0;
  short local_3a8;
  short sStack_3a6;
  short sStack_3a4;
  short sStack_3a2;
  short sStack_3a0;
  short sStack_39e;
  short sStack_39c;
  short sStack_39a;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  int local_348;
  undefined4 local_344;
  int local_340;
  long local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  int local_31c;
  undefined2 local_318;
  undefined2 local_316;
  undefined2 local_314;
  undefined1 local_311;
  undefined1 (*local_310) [16];
  undefined1 (*local_308) [16];
  undefined4 local_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined4 local_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined4 local_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  undefined4 local_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  ulong local_68;
  ulong uStack_60;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  ulong local_48;
  ulong uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_10 [3];
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  undefined1 local_8 [3];
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  
  local_31c = 0x20;
  local_328 = local_708;
  local_330 = local_b08;
  local_344 = 6;
  local_348 = 0x3f;
  local_314 = 0x10;
  local_6a = 0x10;
  local_6c = 0x10;
  local_6e = 0x10;
  local_70 = 0x10;
  local_72 = 0x10;
  local_74 = 0x10;
  local_76 = 0x10;
  local_78 = 0x10;
  local_388 = 0x10001000100010;
  uStack_380 = 0x10001000100010;
  local_311 = *(undefined1 *)(in_RDX + 0x3f);
  local_8[2] = local_311;
  local_8[1] = local_311;
  local_8[0] = local_311;
  local_10[2] = local_311;
  local_10[1] = local_311;
  local_10[0] = local_311;
  local_398 = CONCAT17(local_311,
                       CONCAT16(local_311,
                                CONCAT15(local_311,CONCAT14(local_311,CONCAT13(local_311,local_10)))
                               ));
  uStack_390 = CONCAT17(local_311,
                        CONCAT16(local_311,
                                 CONCAT15(local_311,CONCAT14(local_311,CONCAT13(local_311,local_8)))
                                ));
  local_316 = 0x3f;
  local_4a = 0x3f;
  local_4c = 0x3f;
  local_4e = 0x3f;
  local_50 = 0x3f;
  local_52 = 0x3f;
  local_54 = 0x3f;
  local_56 = 0x3f;
  local_58 = 0x3f;
  local_3b8 = 0x3f003f003f003f;
  uStack_3b0 = 0x3f003f003f003f;
  local_3c0 = 0;
  local_3bc = in_R8D;
  local_340 = in_R8D;
  local_338 = in_RDX;
  local_88 = local_388;
  uStack_80 = uStack_380;
  local_68 = local_3b8;
  uStack_60 = uStack_3b0;
  local_28 = local_398;
  uStack_20 = uStack_390;
  local_d = local_311;
  local_c = local_311;
  local_b = local_311;
  local_a = local_311;
  local_9 = local_311;
  local_5 = local_311;
  local_4 = local_311;
  local_3 = local_311;
  local_2 = local_311;
  local_1 = local_311;
  while( true ) {
    if (local_31c <= local_3c0) goto LAB_00543024;
    iVar76 = local_3bc >> 6;
    iVar77 = local_348 - iVar76;
    local_440 = iVar77;
    local_43c = iVar76;
    if (iVar77 < 1) break;
    if (0x20 < iVar77) {
      local_440 = 0x20;
    }
    local_318 = (undefined2)local_3bc;
    local_2a = (undefined2)local_3bc;
    local_2c = (undefined2)local_3bc;
    local_2e = (undefined2)local_3bc;
    local_30 = (undefined2)local_3bc;
    local_32 = (undefined2)local_3bc;
    local_34 = (undefined2)local_3bc;
    local_36 = (undefined2)local_3bc;
    local_38 = (undefined2)local_3bc;
    local_298 = CONCAT26((undefined2)local_3bc,
                         CONCAT24((undefined2)local_3bc,
                                  CONCAT22((undefined2)local_3bc,(undefined2)local_3bc)));
    uStack_290 = CONCAT26((undefined2)local_3bc,
                          CONCAT24((undefined2)local_3bc,
                                   CONCAT22((undefined2)local_3bc,(undefined2)local_3bc)));
    local_2a8 = local_3b8;
    uStack_2a0 = uStack_3b0;
    uVar83 = local_298 & local_3b8;
    uVar95 = uStack_290 & uStack_3b0;
    local_2bc = 1;
    local_2b8._0_2_ = (ushort)uVar83;
    local_2b8._2_2_ = (ushort)(uVar83 >> 0x10);
    local_2b8._4_2_ = (ushort)(uVar83 >> 0x20);
    uStack_2b0._0_2_ = (ushort)uVar95;
    uStack_2b0._2_2_ = (ushort)(uVar95 >> 0x10);
    uStack_2b0._4_2_ = (ushort)(uVar95 >> 0x20);
    uVar81 = (ushort)local_2b8 >> 1;
    uVar87 = local_2b8._2_2_ >> 1;
    uVar89 = local_2b8._4_2_ >> 1;
    uVar91 = (ushort)(uVar83 >> 0x31);
    uVar93 = (ushort)uStack_2b0 >> 1;
    uVar96 = uStack_2b0._2_2_ >> 1;
    uVar98 = uStack_2b0._4_2_ >> 1;
    uVar100 = (ushort)(uVar95 >> 0x31);
    local_460 = 0;
    local_2b8 = uVar83;
    uStack_2b0 = uVar95;
    local_48 = local_298;
    uStack_40 = uStack_290;
    for (local_45c = 0; uVar61 = uStack_390, local_45c < 0x20; local_45c = local_45c + 0x10) {
      local_464 = local_440 - local_45c;
      if (local_464 < 1) {
        (&local_418)[(long)local_460 * 2] = local_398;
        (&uStack_410)[(long)local_460 * 2] = uVar61;
      }
      else {
        local_308 = (undefined1 (*) [16])(local_338 + iVar76 + (long)local_45c);
        local_428 = *(undefined8 *)*local_308;
        uStack_420 = *(undefined8 *)(*local_308 + 8);
        local_218 = *local_308;
        local_310 = (undefined1 (*) [16])((long)local_45c + 1 + local_338 + iVar76);
        local_438 = *(undefined8 *)*local_310;
        uStack_430 = *(undefined8 *)(*local_310 + 8);
        local_228 = *local_310;
        auVar84 = pmovzxbw(local_218,local_428);
        auVar85 = pmovzxbw(local_228,local_438);
        local_368._0_8_ = auVar85._0_8_;
        local_368._8_8_ = auVar85._8_8_;
        local_358._0_8_ = auVar84._0_8_;
        local_358._8_8_ = auVar84._8_8_;
        local_1d8 = local_368._0_8_;
        uVar68 = local_1d8;
        uStack_1d0 = local_368._8_8_;
        uVar69 = uStack_1d0;
        local_1e8 = local_358._0_8_;
        uVar66 = local_1e8;
        uStack_1e0 = local_358._8_8_;
        uVar67 = uStack_1e0;
        local_1d8._0_2_ = auVar85._0_2_;
        local_1d8._2_2_ = auVar85._2_2_;
        local_1d8._4_2_ = auVar85._4_2_;
        local_1d8._6_2_ = auVar85._6_2_;
        uStack_1d0._0_2_ = auVar85._8_2_;
        uStack_1d0._2_2_ = auVar85._10_2_;
        uStack_1d0._4_2_ = auVar85._12_2_;
        uStack_1d0._6_2_ = auVar85._14_2_;
        local_1e8._0_2_ = auVar84._0_2_;
        local_1e8._2_2_ = auVar84._2_2_;
        local_1e8._4_2_ = auVar84._4_2_;
        local_1e8._6_2_ = auVar84._6_2_;
        uStack_1e0._0_2_ = auVar84._8_2_;
        uStack_1e0._2_2_ = auVar84._10_2_;
        uStack_1e0._4_2_ = auVar84._12_2_;
        uStack_1e0._6_2_ = auVar84._14_2_;
        local_258 = local_358._0_8_;
        uStack_250 = local_358._8_8_;
        local_25c = 5;
        auVar84 = psllw(auVar84,ZEXT416(5));
        local_378 = auVar84._0_8_;
        uStack_370 = auVar84._8_8_;
        local_158 = local_378;
        uVar74 = local_158;
        uStack_150 = uStack_370;
        uVar75 = uStack_150;
        local_168 = local_388;
        uVar72 = local_168;
        uStack_160 = uStack_380;
        uVar73 = uStack_160;
        local_158._0_2_ = auVar84._0_2_;
        local_158._2_2_ = auVar84._2_2_;
        local_158._4_2_ = auVar84._4_2_;
        local_158._6_2_ = auVar84._6_2_;
        uStack_150._0_2_ = auVar84._8_2_;
        uStack_150._2_2_ = auVar84._10_2_;
        uStack_150._4_2_ = auVar84._12_2_;
        uStack_150._6_2_ = auVar84._14_2_;
        local_168._0_2_ = (short)local_388;
        local_168._2_2_ = (short)((ulong)local_388 >> 0x10);
        local_168._4_2_ = (short)((ulong)local_388 >> 0x20);
        local_168._6_2_ = (short)((ulong)local_388 >> 0x30);
        uStack_160._0_2_ = (short)uStack_380;
        uStack_160._2_2_ = (short)((ulong)uStack_380 >> 0x10);
        uStack_160._4_2_ = (short)((ulong)uStack_380 >> 0x20);
        uStack_160._6_2_ = (short)((ulong)uStack_380 >> 0x30);
        local_378._0_4_ =
             CONCAT22(local_158._2_2_ + local_168._2_2_,(short)local_158 + (short)local_168);
        local_378._0_6_ = CONCAT24(local_158._4_2_ + local_168._4_2_,(undefined4)local_378);
        local_378 = CONCAT26(local_158._6_2_ + local_168._6_2_,(undefined6)local_378);
        uStack_370._0_2_ = (short)uStack_150 + (short)uStack_160;
        uStack_370._2_2_ = uStack_150._2_2_ + uStack_160._2_2_;
        uStack_370._4_2_ = uStack_150._4_2_ + uStack_160._4_2_;
        uStack_370._6_2_ = uStack_150._6_2_ + uStack_160._6_2_;
        local_118 = CONCAT26(local_1d8._6_2_ - local_1e8._6_2_,
                             CONCAT24(local_1d8._4_2_ - local_1e8._4_2_,
                                      CONCAT22(local_1d8._2_2_ - local_1e8._2_2_,
                                               (short)local_1d8 - (short)local_1e8)));
        uStack_110 = CONCAT26(uStack_1d0._6_2_ - uStack_1e0._6_2_,
                              CONCAT24(uStack_1d0._4_2_ - uStack_1e0._4_2_,
                                       CONCAT22(uStack_1d0._2_2_ - uStack_1e0._2_2_,
                                                (short)uStack_1d0 - (short)uStack_1e0)));
        local_128 = CONCAT26(uVar91,CONCAT24(uVar89,CONCAT22(uVar87,uVar81)));
        uStack_120 = CONCAT26(uVar100,CONCAT24(uVar98,CONCAT22(uVar96,uVar93)));
        sVar82 = ((short)local_1d8 - (short)local_1e8) * uVar81;
        sVar88 = (local_1d8._2_2_ - local_1e8._2_2_) * uVar87;
        sVar90 = (local_1d8._4_2_ - local_1e8._4_2_) * uVar89;
        sVar92 = (local_1d8._6_2_ - local_1e8._6_2_) * uVar91;
        sVar94 = ((short)uStack_1d0 - (short)uStack_1e0) * uVar93;
        sVar97 = (uStack_1d0._2_2_ - uStack_1e0._2_2_) * uVar96;
        sVar99 = (uStack_1d0._4_2_ - uStack_1e0._4_2_) * uVar98;
        sVar101 = (uStack_1d0._6_2_ - uStack_1e0._6_2_) * uVar100;
        local_188 = CONCAT26(sVar92,CONCAT24(sVar90,CONCAT22(sVar88,sVar82)));
        uStack_180 = CONCAT26(sVar101,CONCAT24(sVar99,CONCAT22(sVar97,sVar94)));
        local_178 = local_378;
        uStack_170 = uStack_370;
        local_3e8 = (short)local_158 + (short)local_168 + sVar82;
        uStack_3e6 = local_158._2_2_ + local_168._2_2_ + sVar88;
        uStack_3e4 = local_158._4_2_ + local_168._4_2_ + sVar90;
        uStack_3e2 = local_158._6_2_ + local_168._6_2_ + sVar92;
        uStack_3e0 = (short)uStack_150 + (short)uStack_160 + sVar94;
        uStack_3de = uStack_150._2_2_ + uStack_160._2_2_ + sVar97;
        uStack_3dc = uStack_150._4_2_ + uStack_160._4_2_ + sVar99;
        uStack_3da = uStack_150._6_2_ + uStack_160._6_2_ + sVar101;
        local_2d8 = CONCAT26(uStack_3e2,CONCAT24(uStack_3e4,CONCAT22(uStack_3e6,local_3e8)));
        uStack_2d0 = CONCAT26(uStack_3da,CONCAT24(uStack_3dc,CONCAT22(uStack_3de,uStack_3e0)));
        local_2dc = 5;
        local_3e8 = local_3e8 >> 5;
        uStack_3e6 = uStack_3e6 >> 5;
        uStack_3e4 = uStack_3e4 >> 5;
        uStack_3e2 = uStack_3e2 >> 5;
        uStack_3e0 = uStack_3e0 >> 5;
        uStack_3de = uStack_3de >> 5;
        uStack_3dc = uStack_3dc >> 5;
        uStack_3da = uStack_3da >> 5;
        auVar84 = *local_308 >> 0x40;
        local_238._0_8_ = SUB168(*local_308,8);
        local_358 = pmovzxbw(auVar84,local_238._0_8_);
        auVar85 = *local_310 >> 0x40;
        local_248._0_8_ = SUB168(*local_310,8);
        local_368 = pmovzxbw(auVar85,local_248._0_8_);
        local_1f8 = local_368._0_8_;
        uVar63 = local_1f8;
        uStack_1f0 = local_368._8_8_;
        uVar64 = uStack_1f0;
        local_208 = local_358._0_8_;
        uVar61 = local_208;
        uStack_200 = local_358._8_8_;
        uVar62 = uStack_200;
        local_1f8._0_2_ = local_368._0_2_;
        local_1f8._2_2_ = local_368._2_2_;
        local_1f8._4_2_ = local_368._4_2_;
        local_1f8._6_2_ = local_368._6_2_;
        uStack_1f0._0_2_ = local_368._8_2_;
        uStack_1f0._2_2_ = local_368._10_2_;
        uStack_1f0._4_2_ = local_368._12_2_;
        uStack_1f0._6_2_ = local_368._14_2_;
        local_208._0_2_ = local_358._0_2_;
        local_208._2_2_ = local_358._2_2_;
        local_208._4_2_ = local_358._4_2_;
        local_208._6_2_ = local_358._6_2_;
        uStack_200._0_2_ = local_358._8_2_;
        uStack_200._2_2_ = local_358._10_2_;
        uStack_200._4_2_ = local_358._12_2_;
        uStack_200._6_2_ = local_358._14_2_;
        local_3a8 = (short)local_1f8 - (short)local_208;
        sStack_3a6 = local_1f8._2_2_ - local_208._2_2_;
        sStack_3a4 = local_1f8._4_2_ - local_208._4_2_;
        sStack_3a2 = local_1f8._6_2_ - local_208._6_2_;
        sStack_3a0 = (short)uStack_1f0 - (short)uStack_200;
        sStack_39e = uStack_1f0._2_2_ - uStack_200._2_2_;
        sStack_39c = uStack_1f0._4_2_ - uStack_200._4_2_;
        sStack_39a = uStack_1f0._6_2_ - uStack_200._6_2_;
        local_278 = local_358._0_8_;
        uStack_270 = local_358._8_8_;
        local_27c = 5;
        auVar86 = psllw(local_358,ZEXT416(5));
        local_378 = auVar86._0_8_;
        uStack_370 = auVar86._8_8_;
        local_198 = local_378;
        uVar70 = local_198;
        uStack_190 = uStack_370;
        uVar71 = uStack_190;
        local_1a8 = local_388;
        uStack_1a0 = uStack_380;
        local_198._0_2_ = auVar86._0_2_;
        local_198._2_2_ = auVar86._2_2_;
        local_198._4_2_ = auVar86._4_2_;
        local_198._6_2_ = auVar86._6_2_;
        uStack_190._0_2_ = auVar86._8_2_;
        uStack_190._2_2_ = auVar86._10_2_;
        uStack_190._4_2_ = auVar86._12_2_;
        uStack_190._6_2_ = auVar86._14_2_;
        local_378._0_4_ =
             CONCAT22(local_198._2_2_ + local_168._2_2_,(short)local_198 + (short)local_168);
        local_378._0_6_ = CONCAT24(local_198._4_2_ + local_168._4_2_,(undefined4)local_378);
        local_378 = CONCAT26(local_198._6_2_ + local_168._6_2_,(undefined6)local_378);
        uStack_370._0_2_ = (short)uStack_190 + (short)uStack_160;
        uStack_370._2_2_ = uStack_190._2_2_ + uStack_160._2_2_;
        uStack_370._4_2_ = uStack_190._4_2_ + uStack_160._4_2_;
        uStack_370._6_2_ = uStack_190._6_2_ + uStack_160._6_2_;
        local_138 = CONCAT26(sStack_3a2,CONCAT24(sStack_3a4,CONCAT22(sStack_3a6,local_3a8)));
        uStack_130 = CONCAT26(sStack_39a,CONCAT24(sStack_39c,CONCAT22(sStack_39e,sStack_3a0)));
        local_148 = CONCAT26(uVar91,CONCAT24(uVar89,CONCAT22(uVar87,uVar81)));
        uStack_140 = CONCAT26(uVar100,CONCAT24(uVar98,CONCAT22(uVar96,uVar93)));
        local_3d8 = local_3a8 * uVar81;
        sStack_3d6 = sStack_3a6 * uVar87;
        sStack_3d4 = sStack_3a4 * uVar89;
        sStack_3d2 = sStack_3a2 * uVar91;
        sStack_3d0 = sStack_3a0 * uVar93;
        sStack_3ce = sStack_39e * uVar96;
        sStack_3cc = sStack_39c * uVar98;
        sStack_3ca = sStack_39a * uVar100;
        local_1c8 = CONCAT26(sStack_3d2,CONCAT24(sStack_3d4,CONCAT22(sStack_3d6,local_3d8)));
        uStack_1c0 = CONCAT26(sStack_3ca,CONCAT24(sStack_3cc,CONCAT22(sStack_3ce,sStack_3d0)));
        local_1b8 = local_378;
        uStack_1b0 = uStack_370;
        local_3f8 = (short)local_198 + (short)local_168 + local_3d8;
        uStack_3f6 = local_198._2_2_ + local_168._2_2_ + sStack_3d6;
        uStack_3f4 = local_198._4_2_ + local_168._4_2_ + sStack_3d4;
        uStack_3f2 = local_198._6_2_ + local_168._6_2_ + sStack_3d2;
        uStack_3f0 = (short)uStack_190 + (short)uStack_160 + sStack_3d0;
        uStack_3ee = uStack_190._2_2_ + uStack_160._2_2_ + sStack_3ce;
        uStack_3ec = uStack_190._4_2_ + uStack_160._4_2_ + sStack_3cc;
        uStack_3ea = uStack_190._6_2_ + uStack_160._6_2_ + sStack_3ca;
        local_2f8 = CONCAT26(uStack_3f2,CONCAT24(uStack_3f4,CONCAT22(uStack_3f6,local_3f8)));
        uStack_2f0 = CONCAT26(uStack_3ea,CONCAT24(uStack_3ec,CONCAT22(uStack_3ee,uStack_3f0)));
        local_2fc = 5;
        local_3f8 = local_3f8 >> 5;
        uStack_3f6 = uStack_3f6 >> 5;
        uStack_3f4 = uStack_3f4 >> 5;
        uStack_3f2 = uStack_3f2 >> 5;
        uStack_3f0 = uStack_3f0 >> 5;
        uStack_3ee = uStack_3ee >> 5;
        uStack_3ec = uStack_3ec >> 5;
        uStack_3ea = uStack_3ea >> 5;
        local_f8 = CONCAT26(uStack_3e2,CONCAT24(uStack_3e4,CONCAT22(uStack_3e6,local_3e8)));
        uStack_f0 = CONCAT26(uStack_3da,CONCAT24(uStack_3dc,CONCAT22(uStack_3de,uStack_3e0)));
        local_108 = CONCAT26(uStack_3f2,CONCAT24(uStack_3f4,CONCAT22(uStack_3f6,local_3f8)));
        uStack_100 = CONCAT26(uStack_3ea,CONCAT24(uStack_3ec,CONCAT22(uStack_3ee,uStack_3f0)));
        bVar1 = 0xff < uStack_3e6;
        bVar16 = uStack_3e6 != 0;
        bVar31 = uStack_3e6 < 0x100;
        cVar46 = (char)uStack_3e6;
        bVar2 = 0xff < uStack_3e4;
        bVar17 = uStack_3e4 != 0;
        bVar32 = uStack_3e4 < 0x100;
        cVar47 = (char)uStack_3e4;
        bVar3 = 0xff < uStack_3e2;
        bVar18 = uStack_3e2 != 0;
        bVar33 = uStack_3e2 < 0x100;
        cVar48 = (char)uStack_3e2;
        bVar4 = 0xff < uStack_3e0;
        bVar19 = uStack_3e0 != 0;
        bVar34 = uStack_3e0 < 0x100;
        cVar49 = (char)uStack_3e0;
        bVar5 = 0xff < uStack_3de;
        bVar20 = uStack_3de != 0;
        bVar35 = uStack_3de < 0x100;
        cVar50 = (char)uStack_3de;
        bVar6 = 0xff < uStack_3dc;
        bVar21 = uStack_3dc != 0;
        bVar36 = uStack_3dc < 0x100;
        cVar51 = (char)uStack_3dc;
        bVar7 = 0xff < uStack_3da;
        bVar22 = uStack_3da != 0;
        bVar37 = uStack_3da < 0x100;
        cVar52 = (char)uStack_3da;
        bVar8 = 0xff < local_3f8;
        bVar23 = local_3f8 != 0;
        bVar38 = local_3f8 < 0x100;
        cVar53 = (char)local_3f8;
        bVar9 = 0xff < uStack_3f6;
        bVar24 = uStack_3f6 != 0;
        bVar39 = uStack_3f6 < 0x100;
        cVar54 = (char)uStack_3f6;
        bVar10 = 0xff < uStack_3f4;
        bVar25 = uStack_3f4 != 0;
        bVar40 = uStack_3f4 < 0x100;
        cVar55 = (char)uStack_3f4;
        bVar11 = 0xff < uStack_3f2;
        bVar26 = uStack_3f2 != 0;
        bVar41 = uStack_3f2 < 0x100;
        cVar56 = (char)uStack_3f2;
        bVar12 = 0xff < uStack_3f0;
        bVar27 = uStack_3f0 != 0;
        bVar42 = uStack_3f0 < 0x100;
        cVar57 = (char)uStack_3f0;
        bVar13 = 0xff < uStack_3ee;
        bVar28 = uStack_3ee != 0;
        bVar43 = uStack_3ee < 0x100;
        cVar58 = (char)uStack_3ee;
        bVar14 = 0xff < uStack_3ec;
        bVar29 = uStack_3ec != 0;
        bVar44 = uStack_3ec < 0x100;
        cVar59 = (char)uStack_3ec;
        bVar15 = 0xff < uStack_3ea;
        bVar30 = uStack_3ea != 0;
        bVar45 = uStack_3ea < 0x100;
        cVar60 = (char)uStack_3ea;
        lVar79 = (long)local_460;
        lVar80 = lVar79 * 0x10;
        local_248 = auVar85;
        local_238 = auVar84;
        local_208 = uVar61;
        uStack_200 = uVar62;
        local_1f8 = uVar63;
        uStack_1f0 = uVar64;
        local_1e8 = uVar66;
        uStack_1e0 = uVar67;
        local_1d8 = uVar68;
        uStack_1d0 = uVar69;
        local_198 = uVar70;
        uStack_190 = uVar71;
        local_168 = uVar72;
        uStack_160 = uVar73;
        local_158 = uVar74;
        uStack_150 = uVar75;
        *(char *)(&local_418 + lVar79 * 2) =
             (local_3e8 != 0) * (local_3e8 < 0x100) * (char)local_3e8 - (0xff < local_3e8);
        *(char *)((long)&local_418 + lVar80 + 1) = bVar16 * bVar31 * cVar46 - bVar1;
        *(char *)((long)&local_418 + lVar80 + 2) = bVar17 * bVar32 * cVar47 - bVar2;
        *(char *)((long)&local_418 + lVar80 + 3) = bVar18 * bVar33 * cVar48 - bVar3;
        *(char *)((long)&local_418 + lVar80 + 4) = bVar19 * bVar34 * cVar49 - bVar4;
        *(char *)((long)&local_418 + lVar80 + 5) = bVar20 * bVar35 * cVar50 - bVar5;
        *(char *)((long)&local_418 + lVar80 + 6) = bVar21 * bVar36 * cVar51 - bVar6;
        *(char *)((long)&local_418 + lVar80 + 7) = bVar22 * bVar37 * cVar52 - bVar7;
        *(char *)(&uStack_410 + lVar79 * 2) = bVar23 * bVar38 * cVar53 - bVar8;
        *(char *)((long)&uStack_410 + lVar80 + 1) = bVar24 * bVar39 * cVar54 - bVar9;
        *(char *)((long)&uStack_410 + lVar80 + 2) = bVar25 * bVar40 * cVar55 - bVar10;
        *(char *)((long)&uStack_410 + lVar80 + 3) = bVar26 * bVar41 * cVar56 - bVar11;
        *(char *)((long)&uStack_410 + lVar80 + 4) = bVar27 * bVar42 * cVar57 - bVar12;
        *(char *)((long)&uStack_410 + lVar80 + 5) = bVar28 * bVar43 * cVar58 - bVar13;
        *(char *)((long)&uStack_410 + lVar80 + 6) = bVar29 * bVar44 * cVar59 - bVar14;
        *(char *)((long)&uStack_410 + lVar80 + 7) = bVar30 * bVar45 * cVar60 - bVar15;
      }
      local_460 = local_460 + 1;
    }
    uVar61 = *(undefined8 *)Mask[0][local_440];
    uVar62 = *(undefined8 *)(Mask[0][local_440] + 8);
    auVar65._8_8_ = uStack_390;
    auVar65._0_8_ = local_398;
    auVar86._8_8_ = uStack_410;
    auVar86._0_8_ = local_418;
    auVar84 = pblendvb(auVar65,auVar86,(undefined1  [16])Mask[0][local_440]);
    *(undefined1 (*) [16])(local_328 + (long)local_3c0 * 0x10) = auVar84;
    uVar63 = *(undefined8 *)Mask[1][local_440];
    uVar64 = *(undefined8 *)(Mask[1][local_440] + 8);
    auVar85._8_8_ = uStack_390;
    auVar85._0_8_ = local_398;
    auVar84._8_8_ = uStack_400;
    auVar84._0_8_ = local_408;
    auVar84 = pblendvb(auVar85,auVar84,(undefined1  [16])Mask[1][local_440]);
    *(undefined1 (*) [16])(local_330 + (long)local_3c0 * 0x10) = auVar84;
    local_3bc = local_340 + local_3bc;
    local_3c0 = local_3c0 + 1;
    local_458 = uVar81;
    uStack_456 = uVar87;
    uStack_454 = uVar89;
    uStack_452 = uVar91;
    uStack_450 = uVar93;
    uStack_44e = uVar96;
    uStack_44c = uVar98;
    uStack_44a = uVar100;
    local_e8 = uVar63;
    uStack_e0 = uVar64;
    local_c8 = local_398;
    uStack_c0 = uStack_390;
    local_b8 = uVar61;
    uStack_b0 = uVar62;
    local_98 = local_398;
    uStack_90 = uStack_390;
  }
  for (local_444 = local_3c0; local_444 < local_31c; local_444 = local_444 + 1) {
    *(undefined8 *)(local_328 + (long)local_444 * 0x10) = local_398;
    *(undefined8 *)((long)(local_328 + (long)local_444 * 0x10) + 8) = uStack_390;
    *(undefined8 *)(local_330 + (long)local_444 * 0x10) = local_398;
    *(undefined8 *)((long)(local_330 + (long)local_444 * 0x10) + 8) = uStack_390;
  }
LAB_00543024:
  local_4f8 = in_RSI;
  local_4f0 = in_RDI;
  transpose16x16_sse2(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  transpose16x16_sse2(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  transpose16x16_sse2(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  transpose16x16_sse2(in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  for (local_d0c = 0; local_d0c < 0x10; local_d0c = local_d0c + 1) {
    puVar78 = (undefined8 *)(local_4f0 + local_d0c * local_4f8);
    uVar61 = local_908[(long)local_d0c * 2 + 1];
    *puVar78 = local_908[(long)local_d0c * 2];
    puVar78[1] = uVar61;
    lVar79 = local_4f0 + local_d0c * local_4f8;
    uVar61 = local_908[(long)(local_d0c + 0x10) * 2 + 1];
    *(undefined8 *)(lVar79 + 0x10) = local_908[(long)(local_d0c + 0x10) * 2];
    *(undefined8 *)(lVar79 + 0x18) = uVar61;
  }
  for (local_d10 = 0; local_d10 < 0x10; local_d10 = local_d10 + 1) {
    puVar78 = (undefined8 *)(local_4f0 + (local_d10 + 0x10) * local_4f8);
    uVar61 = local_d08[(long)local_d10 * 2 + 1];
    *puVar78 = local_d08[(long)local_d10 * 2];
    puVar78[1] = uVar61;
    lVar79 = local_4f0 + (local_d10 + 0x10) * local_4f8;
    uVar61 = local_d08[(long)(local_d10 + 0x10) * 2 + 1];
    *(undefined8 *)(lVar79 + 0x10) = local_d08[(long)(local_d10 + 0x10) * 2];
    *(undefined8 *)(lVar79 + 0x18) = uVar61;
  }
  return;
}

Assistant:

static void dr_prediction_z3_32x32_sse4_1(uint8_t *dst, ptrdiff_t stride,
                                          const uint8_t *left,
                                          int upsample_left, int dy) {
  __m128i dstvec[32], d[32], dstvec_h[32], d_h[32];

  dr_prediction_z1_32xN_internal_sse4_1(32, dstvec, dstvec_h, left,
                                        upsample_left, dy);
  transpose16x16_sse2(dstvec, d);
  transpose16x16_sse2(dstvec_h, d_h);
  transpose16x16_sse2(dstvec + 16, d + 16);
  transpose16x16_sse2(dstvec_h + 16, d_h + 16);
  for (int j = 0; j < 16; j++) {
    _mm_storeu_si128((__m128i *)(dst + j * stride), d[j]);
    _mm_storeu_si128((__m128i *)(dst + j * stride + 16), d[j + 16]);
  }
  for (int j = 0; j < 16; j++) {
    _mm_storeu_si128((__m128i *)(dst + (j + 16) * stride), d_h[j]);
    _mm_storeu_si128((__m128i *)(dst + (j + 16) * stride + 16), d_h[j + 16]);
  }
}